

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::avx::
     BVHNIntersectorKHybrid<4,_8,_16781328,_false,_embree::avx::VirtualCurveIntersectorK<8>,_true>::
     occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray,
              TravRayK<8,_false> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  int iVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  char cVar17;
  AABBNodeMB4D *node1;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  long lVar21;
  ulong uVar22;
  undefined4 uVar23;
  ulong unaff_RBP;
  ulong uVar24;
  size_t sVar25;
  NodeRef *pNVar26;
  NodeRef *pNVar27;
  ulong uVar28;
  ulong uVar29;
  float fVar30;
  float fVar31;
  float fVar36;
  float fVar38;
  vint4 bi;
  undefined1 auVar32 [16];
  float fVar40;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float fVar37;
  float fVar39;
  float fVar41;
  undefined1 auVar35 [16];
  float fVar42;
  float fVar43;
  float fVar49;
  float fVar51;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  float fVar53;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  float fVar50;
  float fVar52;
  float fVar54;
  undefined1 auVar48 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  float fVar63;
  float fVar70;
  float fVar71;
  vint4 bi_1;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  float fVar72;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  vint4 ai_1;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  vint4 ai_3;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  vint4 ai;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  NodeRef stack [244];
  
  stack[0] = root;
  fVar3 = *(float *)((long)&(tray->org).field_0 + k * 4);
  auVar81._4_4_ = fVar3;
  auVar81._0_4_ = fVar3;
  auVar81._8_4_ = fVar3;
  auVar81._12_4_ = fVar3;
  fVar4 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar84._4_4_ = fVar4;
  auVar84._0_4_ = fVar4;
  auVar84._8_4_ = fVar4;
  auVar84._12_4_ = fVar4;
  fVar5 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  auVar83._4_4_ = fVar5;
  auVar83._0_4_ = fVar5;
  auVar83._8_4_ = fVar5;
  auVar83._12_4_ = fVar5;
  fVar6 = *(float *)((long)&(tray->dir).field_0 + k * 4);
  fVar7 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x20);
  fVar8 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x40);
  fVar9 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar10 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar11 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  uVar28 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar22 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar29 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  iVar12 = (tray->tnear).field_0.i[k];
  auVar85._4_4_ = iVar12;
  auVar85._0_4_ = iVar12;
  auVar85._8_4_ = iVar12;
  auVar85._12_4_ = iVar12;
  iVar12 = (tray->tfar).field_0.i[k];
  auVar86._4_4_ = iVar12;
  auVar86._0_4_ = iVar12;
  auVar86._8_4_ = iVar12;
  auVar86._12_4_ = iVar12;
  pNVar27 = stack + 1;
  do {
    pNVar26 = pNVar27;
    if (pNVar26 == stack) break;
    pNVar27 = pNVar26 + -1;
    sVar25 = pNVar26[-1].ptr;
    do {
      if ((sVar25 & 8) == 0) {
        fVar43 = *(float *)(ray + k * 4 + 0xe0);
        uVar20 = (uint)sVar25 & 7;
        uVar18 = sVar25 & 0xfffffffffffffff0;
        if (uVar20 == 3) {
          auVar32 = vshufps_avx(ZEXT416((uint)fVar43),ZEXT416((uint)fVar43),0);
          fVar43 = 1.0 - fVar43;
          auVar33 = vshufps_avx(ZEXT416((uint)fVar43),ZEXT416((uint)fVar43),0);
          fVar42 = auVar32._0_4_;
          fVar49 = auVar32._4_4_;
          fVar51 = auVar32._8_4_;
          fVar53 = auVar32._12_4_;
          auVar32 = vshufps_avx(ZEXT416((uint)(fVar43 * 0.0)),ZEXT416((uint)(fVar43 * 0.0)),0);
          fVar30 = auVar32._0_4_;
          fVar36 = auVar32._4_4_;
          fVar38 = auVar32._8_4_;
          fVar40 = auVar32._12_4_;
          fVar63 = auVar33._0_4_;
          auVar82._0_4_ = fVar63 + fVar42 * *(float *)(uVar18 + 0x110);
          fVar70 = auVar33._4_4_;
          auVar82._4_4_ = fVar70 + fVar49 * *(float *)(uVar18 + 0x114);
          fVar71 = auVar33._8_4_;
          auVar82._8_4_ = fVar71 + fVar51 * *(float *)(uVar18 + 0x118);
          fVar72 = auVar33._12_4_;
          auVar82._12_4_ = fVar72 + fVar53 * *(float *)(uVar18 + 0x11c);
          auVar33._0_4_ =
               *(float *)(uVar18 + 0x20) * fVar6 +
               fVar7 * *(float *)(uVar18 + 0x50) + *(float *)(uVar18 + 0x80) * fVar8;
          auVar33._4_4_ =
               *(float *)(uVar18 + 0x24) * fVar6 +
               fVar7 * *(float *)(uVar18 + 0x54) + *(float *)(uVar18 + 0x84) * fVar8;
          auVar33._8_4_ =
               *(float *)(uVar18 + 0x28) * fVar6 +
               fVar7 * *(float *)(uVar18 + 0x58) + *(float *)(uVar18 + 0x88) * fVar8;
          auVar33._12_4_ =
               *(float *)(uVar18 + 0x2c) * fVar6 +
               fVar7 * *(float *)(uVar18 + 0x5c) + *(float *)(uVar18 + 0x8c) * fVar8;
          auVar46._0_4_ =
               *(float *)(uVar18 + 0x30) * fVar6 +
               fVar7 * *(float *)(uVar18 + 0x60) + *(float *)(uVar18 + 0x90) * fVar8;
          auVar46._4_4_ =
               *(float *)(uVar18 + 0x34) * fVar6 +
               fVar7 * *(float *)(uVar18 + 100) + *(float *)(uVar18 + 0x94) * fVar8;
          auVar46._8_4_ =
               *(float *)(uVar18 + 0x38) * fVar6 +
               fVar7 * *(float *)(uVar18 + 0x68) + *(float *)(uVar18 + 0x98) * fVar8;
          auVar46._12_4_ =
               *(float *)(uVar18 + 0x3c) * fVar6 +
               fVar7 * *(float *)(uVar18 + 0x6c) + *(float *)(uVar18 + 0x9c) * fVar8;
          auVar66._0_4_ =
               fVar7 * *(float *)(uVar18 + 0x70) + *(float *)(uVar18 + 0xa0) * fVar8 +
               *(float *)(uVar18 + 0x40) * fVar6;
          auVar66._4_4_ =
               fVar7 * *(float *)(uVar18 + 0x74) + *(float *)(uVar18 + 0xa4) * fVar8 +
               *(float *)(uVar18 + 0x44) * fVar6;
          auVar66._8_4_ =
               fVar7 * *(float *)(uVar18 + 0x78) + *(float *)(uVar18 + 0xa8) * fVar8 +
               *(float *)(uVar18 + 0x48) * fVar6;
          auVar66._12_4_ =
               fVar7 * *(float *)(uVar18 + 0x7c) + *(float *)(uVar18 + 0xac) * fVar8 +
               *(float *)(uVar18 + 0x4c) * fVar6;
          auVar76._8_4_ = 0x7fffffff;
          auVar76._0_8_ = 0x7fffffff7fffffff;
          auVar76._12_4_ = 0x7fffffff;
          auVar32 = vandps_avx(auVar33,auVar76);
          auVar79._8_4_ = 0x219392ef;
          auVar79._0_8_ = 0x219392ef219392ef;
          auVar79._12_4_ = 0x219392ef;
          auVar32 = vcmpps_avx(auVar32,auVar79,1);
          auVar33 = vblendvps_avx(auVar33,auVar79,auVar32);
          auVar32 = vandps_avx(auVar46,auVar76);
          auVar32 = vcmpps_avx(auVar32,auVar79,1);
          auVar13 = vblendvps_avx(auVar46,auVar79,auVar32);
          auVar32 = vandps_avx(auVar66,auVar76);
          auVar32 = vcmpps_avx(auVar32,auVar79,1);
          auVar32 = vblendvps_avx(auVar66,auVar79,auVar32);
          auVar14 = vrcpps_avx(auVar33);
          fVar87 = auVar14._0_4_;
          auVar34._0_4_ = fVar87 * auVar33._0_4_;
          fVar88 = auVar14._4_4_;
          auVar34._4_4_ = fVar88 * auVar33._4_4_;
          fVar89 = auVar14._8_4_;
          auVar34._8_4_ = fVar89 * auVar33._8_4_;
          fVar90 = auVar14._12_4_;
          auVar34._12_4_ = fVar90 * auVar33._12_4_;
          auVar77._8_4_ = 0x3f800000;
          auVar77._0_8_ = &DAT_3f8000003f800000;
          auVar77._12_4_ = 0x3f800000;
          auVar33 = vsubps_avx(auVar77,auVar34);
          fVar87 = fVar87 + fVar87 * auVar33._0_4_;
          fVar88 = fVar88 + fVar88 * auVar33._4_4_;
          fVar89 = fVar89 + fVar89 * auVar33._8_4_;
          fVar90 = fVar90 + fVar90 * auVar33._12_4_;
          auVar33 = vrcpps_avx(auVar13);
          fVar43 = auVar33._0_4_;
          auVar47._0_4_ = auVar13._0_4_ * fVar43;
          fVar50 = auVar33._4_4_;
          auVar47._4_4_ = auVar13._4_4_ * fVar50;
          fVar52 = auVar33._8_4_;
          auVar47._8_4_ = auVar13._8_4_ * fVar52;
          fVar54 = auVar33._12_4_;
          auVar47._12_4_ = auVar13._12_4_ * fVar54;
          auVar33 = vsubps_avx(auVar77,auVar47);
          fVar43 = fVar43 + fVar43 * auVar33._0_4_;
          fVar50 = fVar50 + fVar50 * auVar33._4_4_;
          fVar52 = fVar52 + fVar52 * auVar33._8_4_;
          fVar54 = fVar54 + fVar54 * auVar33._12_4_;
          auVar33 = vrcpps_avx(auVar32);
          fVar31 = auVar33._0_4_;
          auVar67._0_4_ = auVar32._0_4_ * fVar31;
          fVar37 = auVar33._4_4_;
          auVar67._4_4_ = auVar32._4_4_ * fVar37;
          fVar39 = auVar33._8_4_;
          auVar67._8_4_ = auVar32._8_4_ * fVar39;
          fVar41 = auVar33._12_4_;
          auVar67._12_4_ = auVar32._12_4_ * fVar41;
          auVar32 = vsubps_avx(auVar77,auVar67);
          fVar31 = fVar31 + fVar31 * auVar32._0_4_;
          fVar37 = fVar37 + fVar37 * auVar32._4_4_;
          fVar39 = fVar39 + fVar39 * auVar32._8_4_;
          fVar41 = fVar41 + fVar41 * auVar32._12_4_;
          auVar68._0_4_ =
               fVar3 * *(float *)(uVar18 + 0x20) +
               fVar4 * *(float *)(uVar18 + 0x50) +
               *(float *)(uVar18 + 0x80) * fVar5 + *(float *)(uVar18 + 0xb0);
          auVar68._4_4_ =
               fVar3 * *(float *)(uVar18 + 0x24) +
               fVar4 * *(float *)(uVar18 + 0x54) +
               *(float *)(uVar18 + 0x84) * fVar5 + *(float *)(uVar18 + 0xb4);
          auVar68._8_4_ =
               fVar3 * *(float *)(uVar18 + 0x28) +
               fVar4 * *(float *)(uVar18 + 0x58) +
               *(float *)(uVar18 + 0x88) * fVar5 + *(float *)(uVar18 + 0xb8);
          auVar68._12_4_ =
               fVar3 * *(float *)(uVar18 + 0x2c) +
               fVar4 * *(float *)(uVar18 + 0x5c) +
               *(float *)(uVar18 + 0x8c) * fVar5 + *(float *)(uVar18 + 0xbc);
          auVar62._0_4_ =
               fVar3 * *(float *)(uVar18 + 0x30) +
               *(float *)(uVar18 + 0x90) * fVar5 + *(float *)(uVar18 + 0xc0) +
               fVar4 * *(float *)(uVar18 + 0x60);
          auVar62._4_4_ =
               fVar3 * *(float *)(uVar18 + 0x34) +
               *(float *)(uVar18 + 0x94) * fVar5 + *(float *)(uVar18 + 0xc4) +
               fVar4 * *(float *)(uVar18 + 100);
          auVar62._8_4_ =
               fVar3 * *(float *)(uVar18 + 0x38) +
               *(float *)(uVar18 + 0x98) * fVar5 + *(float *)(uVar18 + 200) +
               fVar4 * *(float *)(uVar18 + 0x68);
          auVar62._12_4_ =
               fVar3 * *(float *)(uVar18 + 0x3c) +
               *(float *)(uVar18 + 0x9c) * fVar5 + *(float *)(uVar18 + 0xcc) +
               fVar4 * *(float *)(uVar18 + 0x6c);
          auVar57._0_4_ =
               fVar3 * *(float *)(uVar18 + 0x40) +
               fVar4 * *(float *)(uVar18 + 0x70) +
               fVar5 * *(float *)(uVar18 + 0xa0) + *(float *)(uVar18 + 0xd0);
          auVar57._4_4_ =
               fVar3 * *(float *)(uVar18 + 0x44) +
               fVar4 * *(float *)(uVar18 + 0x74) +
               fVar5 * *(float *)(uVar18 + 0xa4) + *(float *)(uVar18 + 0xd4);
          auVar57._8_4_ =
               fVar3 * *(float *)(uVar18 + 0x48) +
               fVar4 * *(float *)(uVar18 + 0x78) +
               fVar5 * *(float *)(uVar18 + 0xa8) + *(float *)(uVar18 + 0xd8);
          auVar57._12_4_ =
               fVar3 * *(float *)(uVar18 + 0x4c) +
               fVar4 * *(float *)(uVar18 + 0x7c) +
               fVar5 * *(float *)(uVar18 + 0xac) + *(float *)(uVar18 + 0xdc);
          auVar32._4_4_ = fVar36 + fVar49 * *(float *)(uVar18 + 0xe4);
          auVar32._0_4_ = fVar30 + fVar42 * *(float *)(uVar18 + 0xe0);
          auVar32._8_4_ = fVar38 + fVar51 * *(float *)(uVar18 + 0xe8);
          auVar32._12_4_ = fVar40 + fVar53 * *(float *)(uVar18 + 0xec);
          auVar32 = vsubps_avx(auVar32,auVar68);
          auVar33 = vsubps_avx(auVar82,auVar68);
          auVar13._4_4_ = fVar36 + fVar49 * *(float *)(uVar18 + 0xf4);
          auVar13._0_4_ = fVar30 + fVar42 * *(float *)(uVar18 + 0xf0);
          auVar13._8_4_ = fVar38 + fVar51 * *(float *)(uVar18 + 0xf8);
          auVar13._12_4_ = fVar40 + fVar53 * *(float *)(uVar18 + 0xfc);
          auVar13 = vsubps_avx(auVar13,auVar62);
          auVar14._4_4_ = fVar49 * *(float *)(uVar18 + 0x124) + fVar70;
          auVar14._0_4_ = fVar42 * *(float *)(uVar18 + 0x120) + fVar63;
          auVar14._8_4_ = fVar51 * *(float *)(uVar18 + 0x128) + fVar71;
          auVar14._12_4_ = fVar53 * *(float *)(uVar18 + 300) + fVar72;
          auVar14 = vsubps_avx(auVar14,auVar62);
          auVar15._4_4_ = fVar49 * *(float *)(uVar18 + 0x104) + fVar36;
          auVar15._0_4_ = fVar42 * *(float *)(uVar18 + 0x100) + fVar30;
          auVar15._8_4_ = fVar51 * *(float *)(uVar18 + 0x108) + fVar38;
          auVar15._12_4_ = fVar53 * *(float *)(uVar18 + 0x10c) + fVar40;
          auVar15 = vsubps_avx(auVar15,auVar57);
          auVar16._4_4_ = fVar70 + fVar49 * *(float *)(uVar18 + 0x134);
          auVar16._0_4_ = fVar63 + fVar42 * *(float *)(uVar18 + 0x130);
          auVar16._8_4_ = fVar71 + fVar51 * *(float *)(uVar18 + 0x138);
          auVar16._12_4_ = fVar72 + fVar53 * *(float *)(uVar18 + 0x13c);
          auVar16 = vsubps_avx(auVar16,auVar57);
          auVar75._0_4_ = fVar87 * auVar32._0_4_;
          auVar75._4_4_ = fVar88 * auVar32._4_4_;
          auVar75._8_4_ = fVar89 * auVar32._8_4_;
          auVar75._12_4_ = fVar90 * auVar32._12_4_;
          auVar69._0_4_ = fVar87 * auVar33._0_4_;
          auVar69._4_4_ = fVar88 * auVar33._4_4_;
          auVar69._8_4_ = fVar89 * auVar33._8_4_;
          auVar69._12_4_ = fVar90 * auVar33._12_4_;
          auVar78._0_4_ = auVar13._0_4_ * fVar43;
          auVar78._4_4_ = auVar13._4_4_ * fVar50;
          auVar78._8_4_ = auVar13._8_4_ * fVar52;
          auVar78._12_4_ = auVar13._12_4_ * fVar54;
          auVar80._0_4_ = auVar15._0_4_ * fVar31;
          auVar80._4_4_ = auVar15._4_4_ * fVar37;
          auVar80._8_4_ = auVar15._8_4_ * fVar39;
          auVar80._12_4_ = auVar15._12_4_ * fVar41;
          auVar48._0_4_ = auVar14._0_4_ * fVar43;
          auVar48._4_4_ = auVar14._4_4_ * fVar50;
          auVar48._8_4_ = auVar14._8_4_ * fVar52;
          auVar48._12_4_ = auVar14._12_4_ * fVar54;
          auVar35._0_4_ = auVar16._0_4_ * fVar31;
          auVar35._4_4_ = auVar16._4_4_ * fVar37;
          auVar35._8_4_ = auVar16._8_4_ * fVar39;
          auVar35._12_4_ = auVar16._12_4_ * fVar41;
          auVar32 = vpminsd_avx(auVar78,auVar48);
          auVar33 = vpminsd_avx(auVar80,auVar35);
          auVar32 = vmaxps_avx(auVar32,auVar33);
          auVar15 = vpminsd_avx(auVar75,auVar69);
          auVar14 = vpmaxsd_avx(auVar75,auVar69);
          auVar33 = vpmaxsd_avx(auVar78,auVar48);
          auVar13 = vpmaxsd_avx(auVar80,auVar35);
          auVar13 = vminps_avx(auVar33,auVar13);
          auVar33 = vmaxps_avx(auVar85,auVar15);
          auVar32 = vmaxps_avx(auVar33,auVar32);
          auVar33 = vminps_avx(auVar86,auVar14);
          auVar33 = vminps_avx(auVar33,auVar13);
          auVar32 = vcmpps_avx(auVar32,auVar33,2);
        }
        else {
          auVar14 = vshufps_avx(ZEXT416((uint)fVar43),ZEXT416((uint)fVar43),0);
          pfVar2 = (float *)(uVar18 + 0x80 + uVar28);
          fVar43 = auVar14._0_4_;
          fVar31 = auVar14._4_4_;
          fVar50 = auVar14._8_4_;
          fVar37 = auVar14._12_4_;
          pfVar1 = (float *)(uVar18 + 0x20 + uVar28);
          auVar44._0_4_ = fVar43 * *pfVar2 + *pfVar1;
          auVar44._4_4_ = fVar31 * pfVar2[1] + pfVar1[1];
          auVar44._8_4_ = fVar50 * pfVar2[2] + pfVar1[2];
          auVar44._12_4_ = fVar37 * pfVar2[3] + pfVar1[3];
          auVar32 = vsubps_avx(auVar44,auVar81);
          pfVar2 = (float *)(uVar18 + 0x80 + uVar22);
          auVar45._0_4_ = fVar9 * auVar32._0_4_;
          auVar45._4_4_ = fVar9 * auVar32._4_4_;
          auVar45._8_4_ = fVar9 * auVar32._8_4_;
          auVar45._12_4_ = fVar9 * auVar32._12_4_;
          pfVar1 = (float *)(uVar18 + 0x20 + uVar22);
          auVar55._0_4_ = fVar43 * *pfVar2 + *pfVar1;
          auVar55._4_4_ = fVar31 * pfVar2[1] + pfVar1[1];
          auVar55._8_4_ = fVar50 * pfVar2[2] + pfVar1[2];
          auVar55._12_4_ = fVar37 * pfVar2[3] + pfVar1[3];
          auVar32 = vsubps_avx(auVar55,auVar84);
          pfVar2 = (float *)(uVar18 + 0x80 + uVar29);
          pfVar1 = (float *)(uVar18 + 0x20 + uVar29);
          auVar58._0_4_ = fVar43 * *pfVar2 + *pfVar1;
          auVar58._4_4_ = fVar31 * pfVar2[1] + pfVar1[1];
          auVar58._8_4_ = fVar50 * pfVar2[2] + pfVar1[2];
          auVar58._12_4_ = fVar37 * pfVar2[3] + pfVar1[3];
          auVar56._0_4_ = fVar10 * auVar32._0_4_;
          auVar56._4_4_ = fVar10 * auVar32._4_4_;
          auVar56._8_4_ = fVar10 * auVar32._8_4_;
          auVar56._12_4_ = fVar10 * auVar32._12_4_;
          auVar32 = vsubps_avx(auVar58,auVar83);
          auVar59._0_4_ = fVar11 * auVar32._0_4_;
          auVar59._4_4_ = fVar11 * auVar32._4_4_;
          auVar59._8_4_ = fVar11 * auVar32._8_4_;
          auVar59._12_4_ = fVar11 * auVar32._12_4_;
          auVar32 = vmaxps_avx(auVar56,auVar59);
          pfVar2 = (float *)(uVar18 + 0x80 + (uVar28 ^ 0x10));
          pfVar1 = (float *)(uVar18 + 0x20 + (uVar28 ^ 0x10));
          auVar60._0_4_ = fVar43 * *pfVar2 + *pfVar1;
          auVar60._4_4_ = fVar31 * pfVar2[1] + pfVar1[1];
          auVar60._8_4_ = fVar50 * pfVar2[2] + pfVar1[2];
          auVar60._12_4_ = fVar37 * pfVar2[3] + pfVar1[3];
          auVar33 = vsubps_avx(auVar60,auVar81);
          auVar61._0_4_ = fVar9 * auVar33._0_4_;
          auVar61._4_4_ = fVar9 * auVar33._4_4_;
          auVar61._8_4_ = fVar9 * auVar33._8_4_;
          auVar61._12_4_ = fVar9 * auVar33._12_4_;
          pfVar2 = (float *)(uVar18 + 0x80 + (uVar22 ^ 0x10));
          pfVar1 = (float *)(uVar18 + 0x20 + (uVar22 ^ 0x10));
          auVar64._0_4_ = fVar43 * *pfVar2 + *pfVar1;
          auVar64._4_4_ = fVar31 * pfVar2[1] + pfVar1[1];
          auVar64._8_4_ = fVar50 * pfVar2[2] + pfVar1[2];
          auVar64._12_4_ = fVar37 * pfVar2[3] + pfVar1[3];
          auVar33 = vsubps_avx(auVar64,auVar84);
          auVar65._0_4_ = fVar10 * auVar33._0_4_;
          auVar65._4_4_ = fVar10 * auVar33._4_4_;
          auVar65._8_4_ = fVar10 * auVar33._8_4_;
          auVar65._12_4_ = fVar10 * auVar33._12_4_;
          pfVar2 = (float *)(uVar18 + 0x80 + (uVar29 ^ 0x10));
          pfVar1 = (float *)(uVar18 + 0x20 + (uVar29 ^ 0x10));
          auVar73._0_4_ = fVar43 * *pfVar2 + *pfVar1;
          auVar73._4_4_ = fVar31 * pfVar2[1] + pfVar1[1];
          auVar73._8_4_ = fVar50 * pfVar2[2] + pfVar1[2];
          auVar73._12_4_ = fVar37 * pfVar2[3] + pfVar1[3];
          auVar33 = vsubps_avx(auVar73,auVar83);
          auVar74._0_4_ = fVar11 * auVar33._0_4_;
          auVar74._4_4_ = fVar11 * auVar33._4_4_;
          auVar74._8_4_ = fVar11 * auVar33._8_4_;
          auVar74._12_4_ = fVar11 * auVar33._12_4_;
          auVar13 = vminps_avx(auVar65,auVar74);
          auVar33 = vmaxps_avx(auVar85,auVar45);
          auVar32 = vmaxps_avx(auVar33,auVar32);
          auVar33 = vminps_avx(auVar86,auVar61);
          auVar33 = vminps_avx(auVar33,auVar13);
          if (uVar20 == 6) {
            auVar33 = vcmpps_avx(auVar32,auVar33,2);
            auVar32 = vcmpps_avx(*(undefined1 (*) [16])(uVar18 + 0xe0),auVar14,2);
            auVar13 = vcmpps_avx(auVar14,*(undefined1 (*) [16])(uVar18 + 0xf0),1);
            auVar32 = vandps_avx(auVar32,auVar13);
            auVar32 = vandps_avx(auVar32,auVar33);
          }
          else {
            auVar32 = vcmpps_avx(auVar32,auVar33,2);
          }
          auVar32 = vpslld_avx(auVar32,0x1f);
        }
        uVar23 = vmovmskps_avx(auVar32);
        unaff_RBP = CONCAT44((int)(unaff_RBP >> 0x20),uVar23);
      }
      if ((sVar25 & 8) == 0) {
        if (unaff_RBP == 0) {
          uVar20 = 4;
        }
        else {
          uVar18 = sVar25 & 0xfffffffffffffff0;
          lVar21 = 0;
          if (unaff_RBP != 0) {
            for (; (unaff_RBP >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
            }
          }
          uVar20 = 0;
          sVar25 = *(size_t *)(uVar18 + lVar21 * 8);
          uVar24 = unaff_RBP - 1 & unaff_RBP;
          if (uVar24 != 0) {
            pNVar27->ptr = sVar25;
            lVar21 = 0;
            if (uVar24 != 0) {
              for (; (uVar24 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
              }
            }
            uVar19 = uVar24 - 1;
            while( true ) {
              pNVar27 = pNVar27 + 1;
              sVar25 = *(size_t *)(uVar18 + lVar21 * 8);
              uVar19 = uVar19 & uVar24;
              if (uVar19 == 0) break;
              pNVar27->ptr = sVar25;
              lVar21 = 0;
              if (uVar19 != 0) {
                for (; (uVar19 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
                }
              }
              uVar24 = uVar19 - 1;
            }
          }
        }
      }
      else {
        uVar20 = 6;
      }
    } while (uVar20 == 0);
    if (uVar20 == 6) {
      cVar17 = (**(code **)((long)This->leafIntersector +
                           (ulong)*(byte *)(sVar25 & 0xfffffffffffffff0) * 0x40 + 0x28))(pre,ray,k);
      uVar20 = 0;
      if (cVar17 != '\0') {
        *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
        uVar20 = 1;
      }
    }
  } while ((uVar20 & 3) == 0);
  return pNVar26 != stack;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }